

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMffc.c
# Opt level: O2

int Aig_NodeMffcLabelCut(Aig_Man_t *p,Aig_Obj_t *pNode,Vec_Ptr_t *vLeaves)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  int i;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigMffc.c"
                  ,0xf0,"int Aig_NodeMffcLabelCut(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  if (0xfffffffd < (*(uint *)&pNode->field_0x18 & 7) - 7) {
    Aig_ManIncrementTravId(p);
    for (iVar3 = 0; iVar3 < vLeaves->nSize; iVar3 = iVar3 + 1) {
      pvVar2 = Vec_PtrEntry(vLeaves,iVar3);
      *(ulong *)((long)pvVar2 + 0x18) =
           *(ulong *)((long)pvVar2 + 0x18) & 0xffffffff0000003f |
           (ulong)((int)*(ulong *)((long)pvVar2 + 0x18) + 0x40U & 0xffffffc0);
    }
    iVar3 = Aig_NodeDeref_rec(pNode,0,(float *)0x0,(float *)0x0);
    iVar1 = Aig_NodeRefLabel_rec(p,pNode,0);
    for (i = 0; i < vLeaves->nSize; i = i + 1) {
      pvVar2 = Vec_PtrEntry(vLeaves,i);
      *(ulong *)((long)pvVar2 + 0x18) =
           *(ulong *)((long)pvVar2 + 0x18) & 0xffffffff0000003f |
           (ulong)((int)*(ulong *)((long)pvVar2 + 0x18) - 0x40U & 0xffffffc0);
    }
    if (iVar3 == iVar1) {
      if (0 < iVar3) {
        return iVar3;
      }
      __assert_fail("ConeSize1 > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigMffc.c"
                    ,0xfa,"int Aig_NodeMffcLabelCut(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    __assert_fail("ConeSize1 == ConeSize2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigMffc.c"
                  ,0xf9,"int Aig_NodeMffcLabelCut(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  __assert_fail("Aig_ObjIsNode(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigMffc.c"
                ,0xf1,"int Aig_NodeMffcLabelCut(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

int Aig_NodeMffcLabelCut( Aig_Man_t * p, Aig_Obj_t * pNode, Vec_Ptr_t * vLeaves )
{
    Aig_Obj_t * pObj;
    int i, ConeSize1, ConeSize2;
    assert( !Aig_IsComplement(pNode) );
    assert( Aig_ObjIsNode(pNode) );
    Aig_ManIncrementTravId( p );
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pObj, i )
        pObj->nRefs++;
    ConeSize1 = Aig_NodeDeref_rec( pNode, 0, NULL, NULL );
    ConeSize2 = Aig_NodeRefLabel_rec( p, pNode, 0 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pObj, i )
        pObj->nRefs--;
    assert( ConeSize1 == ConeSize2 );
    assert( ConeSize1 > 0 );
    return ConeSize1;
}